

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O0

int __thiscall UnitTest::UnitTester::finalize(UnitTester *this)

{
  ostream *poVar1;
  UnitTester *this_local;
  
  this->m_finalized = true;
  poVar1 = std::operator<<((ostream *)&std::cout,"\n Testing done. ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->passedTests);
  poVar1 = std::operator<<(poVar1," tests passed. ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->failedTests);
  poVar1 = std::operator<<(poVar1," tests failed.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return this->failedTests;
}

Assistant:

int finalize() {
    m_finalized = true;
    std::cout << "\n Testing done. " << passedTests << " tests passed. "
              << failedTests << " tests failed." << std::endl;
    return failedTests;
  }